

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int subpage_register(uc_struct_conflict15 *uc,subpage_t *mmio,uint32_t start,uint32_t end,
                    uint16_t section)

{
  uint local_30;
  int eidx;
  int idx;
  uint16_t section_local;
  uint32_t end_local;
  uint32_t start_local;
  subpage_t *mmio_local;
  uc_struct_conflict15 *uc_local;
  
  if ((start < 0x4000) && (end < 0x4000)) {
    for (local_30 = start & 0x3fff; (int)local_30 <= (int)(end & 0x3fff); local_30 = local_30 + 1) {
      *(uint16_t *)(&mmio[1].iomem.ram + (long)(int)local_30 * 2) = section;
    }
    uc_local._4_4_ = 0;
  }
  else {
    uc_local._4_4_ = -1;
  }
  return uc_local._4_4_;
}

Assistant:

static int subpage_register(struct uc_struct *uc, subpage_t *mmio, uint32_t start, uint32_t end,
                            uint16_t section)
{
    int idx, eidx;

    if (start >= TARGET_PAGE_SIZE || end >= TARGET_PAGE_SIZE)
        return -1;
    idx = SUBPAGE_IDX(start);
    eidx = SUBPAGE_IDX(end);
#if defined(DEBUG_SUBPAGE)
    printf("%s: %p start %08x end %08x idx %08x eidx %08x section %d\n",
           __func__, mmio, start, end, idx, eidx, section);
#endif
    for (; idx <= eidx; idx++) {
        mmio->sub_section[idx] = section;
    }

    return 0;
}